

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileExecutableTargetGenerator::~cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this)

{
  cmMakefileExecutableTargetGenerator *this_local;
  
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileExecutableTargetGenerator_00f506c8;
  std::__cxx11::string::~string((string *)&this->DeviceLinkObject);
  cmMakefileTargetGenerator::~cmMakefileTargetGenerator(&this->super_cmMakefileTargetGenerator);
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator::~cmMakefileExecutableTargetGenerator() =
  default;